

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

int WebRtcAgc_GetAddFarendError(void *state,size_t samples)

{
  int iVar1;
  
  if (state != (void *)0x0) {
    iVar1 = *state;
    if (iVar1 < 32000) {
      if (iVar1 == 8000) {
        if (samples == 0x50) {
          return 0;
        }
        return -1;
      }
      if (iVar1 != 16000) {
        return -1;
      }
    }
    else if ((iVar1 != 32000) && (iVar1 != 48000)) {
      return -1;
    }
    if (samples == 0xa0) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int WebRtcAgc_GetAddFarendError(void *state, size_t samples) {
    LegacyAgc *stt;
    stt = (LegacyAgc *) state;

    if (stt == NULL) return -1;

    if (stt->fs == 8000) {
        if (samples != 80) return -1;
    } else if (stt->fs == 16000 || stt->fs == 32000 || stt->fs == 48000) {
        if (samples != 160) return -1;
    } else {
        return -1;
    }

    return 0;
}